

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::MutexBase::Lock(MutexBase *this)

{
  ostream *poVar1;
  pthread_t pVar2;
  GTestLog local_18;
  int local_14;
  MutexBase *pMStack_10;
  int gtest_error;
  MutexBase *this_local;
  
  pMStack_10 = this;
  local_14 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (local_14 != 0) {
    GTestLog::GTestLog(&local_18,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6aa);
    poVar1 = GTestLog::GetStream(&local_18);
    poVar1 = std::operator<<(poVar1,"pthread_mutex_lock(&mutex_)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_14);
    GTestLog::~GTestLog(&local_18);
  }
  pVar2 = pthread_self();
  this->owner_ = pVar2;
  this->has_owner_ = true;
  return;
}

Assistant:

void Lock() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_lock(&mutex_));
    owner_ = pthread_self();
    has_owner_ = true;
  }